

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::~ansicolor_sink
          (ansicolor_sink<spdlog::details::console_mutex> *this)

{
  (this->super_sink)._vptr_sink = (_func_int **)&PTR__ansicolor_sink_001c6e00;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>::
  ~array(&this->colors_);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&this->formatter_);
  return;
}

Assistant:

~ansicolor_sink() override = default;